

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getopt_pp.h
# Opt level: O1

Result __thiscall
GetOpt::_OptionTBase<int>::operator()
          (_OptionTBase<int> *this,ShortOptions *short_ops,LongOptions *long_ops,Token *param_3,
          fmtflags flags)

{
  char cVar1;
  undefined1 uVar2;
  _Base_ptr p_Var3;
  Result RVar4;
  _Base_ptr p_Var5;
  _Base_ptr *pp_Var6;
  iterator iVar7;
  _Base_ptr p_Var8;
  
  cVar1 = this->short_opt;
  if (cVar1 == '\0') {
    p_Var5 = &(short_ops->_M_t)._M_impl.super__Rb_tree_header._M_header;
  }
  else {
    p_Var5 = &(short_ops->_M_t)._M_impl.super__Rb_tree_header._M_header;
    p_Var8 = p_Var5;
    for (p_Var3 = (short_ops->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var3 != (_Base_ptr)0x0; p_Var3 = (&p_Var3->_M_left)[(char)uVar2 < cVar1]) {
      uVar2 = (undefined1)p_Var3[1]._M_color;
      if (cVar1 <= (char)uVar2) {
        p_Var8 = p_Var3;
      }
    }
    if ((p_Var8 != p_Var5) && ((char)p_Var8[1]._M_color <= cVar1)) {
      p_Var5 = p_Var8;
    }
  }
  if ((_Rb_tree_header *)p_Var5 == &(short_ops->_M_t)._M_impl.super__Rb_tree_header) {
    if (((this->long_opt)._M_string_length == 0) ||
       (iVar7 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GetOpt::OptionData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GetOpt::OptionData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GetOpt::OptionData>_>_>
                ::find(&long_ops->_M_t,&this->long_opt),
       (_Rb_tree_header *)iVar7._M_node == &(long_ops->_M_t)._M_impl.super__Rb_tree_header)) {
      return OptionNotFound;
    }
    iVar7._M_node[2]._M_color = _S_black;
    pp_Var6 = &iVar7._M_node[2]._M_parent;
  }
  else {
    *(undefined4 *)&p_Var5[1]._M_parent = 1;
    pp_Var6 = &p_Var5[1]._M_left;
  }
  RVar4 = (*(this->super__Option)._vptr__Option[3])(this,*pp_Var6,(ulong)(uint)flags,short_ops);
  return RVar4;
}

Assistant:

virtual Result operator()(ShortOptions& short_ops, LongOptions& long_ops, Token* /*first*/, std::ios::fmtflags flags) const
    {
        Result ret = OptionNotFound;
        ShortOptions::iterator it;
        if (short_opt == _Option::NO_SHORT_OPT)
            it = short_ops.end();
        else
            it = short_ops.find(short_opt);

        if (it != short_ops.end())
        {
            it->second.flags = OptionData::CmdLine_Extracted;
            ret = _assign(it->second.token, flags, short_ops);
        }
        else if (!long_opt.empty())
        {
            LongOptions::iterator it = long_ops.find(long_opt);
            if (it != long_ops.end())
            {
                it->second.flags = OptionData::CmdLine_Extracted;
                ret = _assign(it->second.token, flags, short_ops);
            }
        }

        return ret;
    }